

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O2

void __thiscall itis::SplayTree::prettyPrint(SplayTree *this,Node *vertex)

{
  Node *pNVar1;
  Node *pNVar2;
  ostream *poVar3;
  Node *pNVar4;
  char *pcVar5;
  
  do {
    pNVar4 = vertex;
    if (pNVar4 == (Node *)0x0) {
      poVar3 = (ostream *)&std::cout;
      pcVar5 = "empty tree";
LAB_00103886:
      poVar3 = std::operator<<(poVar3,pcVar5);
    }
    else {
      pNVar1 = pNVar4->left_child;
      pNVar2 = pNVar4->right_child;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pNVar4->data);
      if (pNVar1 == (Node *)0x0) {
        if (pNVar2 == (Node *)0x0) {
          pcVar5 = ": no children";
          goto LAB_00103886;
        }
        pcVar5 = ": ";
      }
      else {
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pNVar4->left_child->data);
        if (pNVar2 == (Node *)0x0) goto LAB_001038a9;
        pcVar5 = ", ";
      }
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pNVar4->right_child->data);
    }
LAB_001038a9:
    std::endl<char,std::char_traits<char>>(poVar3);
    vertex = pNVar4->left_child;
    pNVar1 = pNVar4->right_child;
    if (vertex == (Node *)0x0) {
      vertex = pNVar1;
      if (pNVar1 == (Node *)0x0) {
        return;
      }
    }
    else if (pNVar1 != (Node *)0x0) {
      prettyPrint(this,vertex);
      vertex = pNVar4->right_child;
    }
  } while( true );
}

Assistant:

void SplayTree::prettyPrint(Node *vertex) {
    if (vertex == nullptr){
      std::cout << "empty tree" << std::endl;
    } else if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << ", " << vertex->right_child->data << std::endl;
    } else if (vertex->left_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << std::endl;
    } else if (vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->right_child->data << std::endl;
    } else {
      std::cout << vertex->data << ": no children" << std::endl;
    }
    if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      prettyPrint(vertex->left_child);
      prettyPrint(vertex->right_child);
    } else if (vertex->left_child != nullptr) {
      prettyPrint(vertex->left_child);
    } else if (vertex->right_child != nullptr) {
      prettyPrint(vertex->right_child);
    }
  }